

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void __thiscall TestMaterial::RandomTestSupportFunctionAllObjects(TestMaterial *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  long *plVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  time_t tVar14;
  void *__s;
  clock_t cVar15;
  long lVar16;
  clock_t cVar17;
  ostream *poVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  supportVector;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RandomTestSupportFunctionAllObjects",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector(&local_60,((ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8) >> 3) * 1000000,
         (allocator_type *)&local_48);
  tVar14 = time((time_t *)0x0);
  srand((uint)tVar14);
  __s = operator_new(24000000);
  memset(__s,0,24000000);
  lVar22 = 0x10;
  do {
    iVar10 = rand();
    iVar11 = rand();
    iVar12 = rand();
    iVar13 = rand();
    dVar4 = log((double)iVar10 / 2147483647.0);
    dVar4 = dVar4 * -2.0;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar5 = cos(((double)iVar11 / 2147483647.0) * 6.283185307179586);
    dVar6 = log((double)iVar11 / 2147483647.0);
    dVar6 = dVar6 * -2.0;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar7 = cos(((double)iVar10 / 2147483647.0) * 6.283185307179586);
    dVar8 = log((double)iVar12 / 2147483647.0);
    dVar8 = dVar8 * -2.0;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    dVar9 = cos(((double)iVar13 / 2147483647.0) * 6.283185307179586);
    pdVar2 = (double *)((long)__s + lVar22 + -0x10);
    *pdVar2 = dVar5 * dVar4;
    pdVar2[1] = dVar7 * dVar6;
    *(double *)((long)__s + lVar22) = dVar9 * dVar8;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x16e3610);
  cVar15 = clock();
  lVar16 = *(long *)&this->field_0x8;
  lVar22 = *(long *)&this->field_0x10;
  lVar21 = 0;
  lVar19 = 0;
  do {
    bVar24 = lVar22 != lVar16;
    lVar22 = lVar16;
    if (bVar24) {
      lVar20 = 0;
      uVar23 = 0;
      do {
        plVar3 = *(long **)(lVar16 + uVar23 * 8);
        (**(code **)(*plVar3 + 0x20))(&local_48,plVar3,(void *)((long)__s + lVar19 * 0x18));
        lVar22 = (*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3) * lVar21;
        *(undefined8 *)
         ((long)&(local_60.
                  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_z + lVar20 + lVar22) = local_38;
        puVar1 = (undefined8 *)
                 ((long)&(local_60.
                          super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_x + lVar20 + lVar22);
        *puVar1 = local_48;
        puVar1[1] = uStack_40;
        uVar23 = uVar23 + 1;
        lVar16 = *(long *)&this->field_0x8;
        lVar22 = *(long *)&this->field_0x10;
        lVar20 = lVar20 + 0x18;
      } while (uVar23 < (ulong)(lVar22 - lVar16 >> 3));
    }
    lVar19 = lVar19 + 1;
    lVar21 = lVar21 + 0x18;
  } while (lVar19 != 1000000);
  cVar17 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  computation time: ",0x14);
  poVar18 = std::ostream::_M_insert<double>((double)(cVar17 - cVar15) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  operator_delete(__s,24000000);
  if (local_60.
      super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TestMaterial::RandomTestSupportFunctionAllObjects()
{
  std::cout << "RandomTestSupportFunctionAllObjects" << std::endl;
  std::vector<Vector3> supportVector(RandomTestEnd * sObj.size());

  srand(static_cast<unsigned int>(time(NULL)));
  clock_t begin, end;

  std::vector<Vector3> v(RandomTestEnd);

  for (long j=0; j<RandomTestEnd; j++)
  {
    double a = (rand()/double(RAND_MAX)) ;
    double b = (rand()/double(RAND_MAX)) ;
    double c = (rand()/double(RAND_MAX)) ;
    double d = (rand()/double(RAND_MAX)) ;

    v[j]=Vector3(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));
  }

  begin=clock();
  for (long j=0; j<RandomTestEnd; j++)
  {
#ifdef DO_TEST
    for(size_t i=0; i<sObj.size(); i++)
      supportVector[j*sObj.size() + i] = sObj[i]->support(v[j]);
#endif
  }

  end=clock();

  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) <<  std::endl;

#ifdef DO_TEST
# ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_randomtestsupportall_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
  for(size_t i=0; i<supportVector.size(); ++i)
    outfile << supportVector[i] << std::endl;
  outfile.close();
# endif
#endif
}